

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void shape_lore_helper_append_to_list(char *item,char ***list,int *p_nmax,int *p_n)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  
  iVar1 = *p_nmax;
  if (iVar1 <= *p_n) {
    if (iVar1 == 0) {
      uVar2 = 4;
    }
    else {
      if (iVar1 < 1) {
        __assert_fail("*p_nmax > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                      ,0xa62,
                      "void shape_lore_helper_append_to_list(const char *, const char ***, int *, int *)"
                     );
      }
      uVar2 = iVar1 * 2;
    }
    *p_nmax = uVar2;
    ppcVar3 = (char **)mem_realloc(*list,(ulong)uVar2 << 3);
    *list = ppcVar3;
  }
  pcVar4 = string_make(item);
  iVar1 = *p_n;
  (*list)[iVar1] = pcVar4;
  *p_n = iVar1 + 1;
  return;
}

Assistant:

static void shape_lore_helper_append_to_list(const char* item,
	const char ***list, int* p_nmax, int *p_n)
{
	if (*p_n >= *p_nmax) {
		if (*p_nmax == 0) {
			*p_nmax = 4;
		} else {
			assert(*p_nmax > 0);
			*p_nmax *= 2;
		}
		*list = mem_realloc(*list, *p_nmax * sizeof(**list));
	}
	(*list)[*p_n] = string_make(item);
	++*p_n;
}